

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btLemkeAlgorithm.cpp
# Opt level: O3

bool __thiscall
btLemkeAlgorithm::validBasis(btLemkeAlgorithm *this,btAlignedObjectArray<int> *basis)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  iVar1 = basis->m_size;
  uVar4 = (ulong)iVar1;
  if ((long)uVar4 < 1) {
    return true;
  }
  iVar2 = *basis->m_data;
  if (SBORROW4(iVar2,iVar1 * 2) == iVar2 + iVar1 * -2 < 0) {
    return false;
  }
  uVar3 = 1;
  do {
    uVar5 = uVar3;
    if (uVar4 == uVar5) break;
    iVar2 = basis->m_data[uVar5];
    uVar3 = uVar5 + 1;
  } while (SBORROW4(iVar2,iVar1 * 2) != iVar2 + iVar1 * -2 < 0);
  return uVar4 <= uVar5;
}

Assistant:

bool btLemkeAlgorithm::validBasis(const btAlignedObjectArray<int>& basis) 
  {
    bool isValid = true;
    for (int i = 0; i < basis.size(); i++) {
      if (basis[i] >= basis.size() * 2) { //then z0 is in the base
        isValid = false;
        break;
      }
    }

    return isValid;
  }